

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

iterator_element * __thiscall
Disa::Matrix_Sparse::lower_bound
          (iterator_element *__return_storage_ptr__,Matrix_Sparse *this,size_t *i_row,
          size_t *i_column)

{
  ulong uVar1;
  size_t *i_row_00;
  size_t sVar2;
  reference pvVar3;
  reference i_column_00;
  difference_type __n;
  reference value;
  reference this_00;
  Matrix_Sparse local_a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *iter_lower;
  unsigned_long *local_48;
  unsigned_long **local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *iter_end;
  unsigned_long *local_30;
  unsigned_long **local_28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *iter_start;
  size_t *i_column_local;
  size_t *i_row_local;
  Matrix_Sparse *this_local;
  
  uVar1 = *i_row;
  iter_start = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)i_column;
  i_column_local = i_row;
  i_row_local = (size_t *)this;
  sVar2 = size_row(this);
  if (uVar1 < sVar2) {
    iter_end = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            (&this->column_index);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,*i_column_local);
    local_30 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&iter_end,*pvVar3);
    local_28 = &local_30;
    iter_lower = (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              (&this->column_index);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->row_non_zero,*i_column_local + 1);
    local_a0.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)__gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&iter_lower,*pvVar3);
    local_40 = &local_48;
    local_a0.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*local_28;
    local_48 = (unsigned_long *)
               local_a0.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a0.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_a0.element_value.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_a0.element_value.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start,(unsigned_long *)iter_start);
    i_row_00 = i_column_local;
    local_a0.column_size =
         (size_t)&local_a0.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
    i_column_00 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)local_a0.column_size);
    local_a0.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
    local_a0.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            (&this->column_index);
    local_a0.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)local_a0.column_size;
    __n = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_a0.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_a0.row_non_zero.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    local_a0.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&local_a0.column_index.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish,__n);
    value = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                      &local_a0.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (__return_storage_ptr__,this,i_row_00,i_column_00,value);
  }
  else {
    end(&local_a0);
    this_00 = Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator*<Disa::Matrix_Sparse,_true>
                        ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_a0);
    Matrix_Sparse_Row<Disa::Matrix_Sparse>::end(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix_Sparse::iterator_element Matrix_Sparse::lower_bound(const std::size_t& i_row, const std::size_t& i_column) {
  if(i_row < size_row()) {
    const auto& iter_start = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]);
    const auto& iter_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1]);
    const auto& iter_lower = std::lower_bound(iter_start, iter_end, i_column);
    return {this, i_row, &*iter_lower, &*(element_value.begin() + std::distance(column_index.begin(), iter_lower))};
  } else return (*end()).end();
}